

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::level_formatter<spdlog::details::null_scoped_padder>::format
          (level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  string_view_t view;
  
  lVar1 = (ulong)msg->level * 0x10;
  view.size_ = (size_t)dest;
  view.data_ = *(char **)(level::level_string_views + lVar1 + 8);
  fmt_helper::append_string_view(*(fmt_helper **)(level::level_string_views + lVar1),view,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }